

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

void __thiscall Matrix::~Matrix(Matrix *this)

{
  Physical *pPVar1;
  long lVar2;
  long lVar3;
  
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Matrix_00155750;
  if (this->pSize != (int *)0x0) {
    operator_delete__(this->pSize);
  }
  if (this->pMult != (int *)0x0) {
    operator_delete__(this->pMult);
  }
  pPVar1 = this->pPhysicals;
  if (pPVar1 != (Physical *)0x0) {
    lVar2 = *(long *)&pPVar1[-1].physicalUnit.nExpPrefix;
    if (lVar2 != 0) {
      lVar3 = lVar2 * 0x98;
      do {
        Physical::~Physical((Physical *)((long)pPVar1[-1].physicalUnit.siUnits + lVar3 + -0x34));
        lVar3 = lVar3 + -0x98;
      } while (lVar3 != 0);
    }
    operator_delete__(&pPVar1[-1].physicalUnit.nExpPrefix,lVar2 * 0x98 + 8);
  }
  std::__cxx11::string::~string((string *)&this->sMatrixName);
  boost::detail::shared_count::~shared_count(&(this->matrixParent).pn);
  Physical::~Physical(&this->super_Physical);
  return;
}

Assistant:

Matrix::~Matrix()
{
	delete[] pSize;
	delete[] pMult;
	delete[] pPhysicals;
}